

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O0

void __thiscall ODDLParser::OpenDDLParser::pushNode(OpenDDLParser *this,DDLNode *node)

{
  DDLNode *local_18;
  DDLNode *node_local;
  OpenDDLParser *this_local;
  
  if (node != (DDLNode *)0x0) {
    local_18 = node;
    node_local = (DDLNode *)this;
    std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>::push_back
              (&this->m_stack,&local_18);
  }
  return;
}

Assistant:

void OpenDDLParser::pushNode( DDLNode *node ) {
    if( ddl_nullptr == node ) {
        return;
    }

    m_stack.push_back( node );
}